

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Own<kj::AsyncIoProvider,_std::nullptr_t> __thiscall
kj::newAsyncIoProvider(kj *this,LowLevelAsyncIoProvider *lowLevel)

{
  undefined8 *puVar1;
  AsyncIoProvider *extraout_RDX;
  Own<kj::AsyncIoProvider,_std::nullptr_t> OVar2;
  
  puVar1 = (undefined8 *)operator_new(0x78);
  *puVar1 = &PTR_newOneWayPipe_00649820;
  puVar1[1] = lowLevel;
  puVar1[2] = &PTR_parseAddress_00649878;
  puVar1[3] = lowLevel;
  _::NetworkFilter::NetworkFilter((NetworkFilter *)(puVar1 + 4));
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::AsyncIoProviderImpl>::instance;
  *(undefined8 **)(this + 8) = puVar1;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<AsyncIoProvider> newAsyncIoProvider(LowLevelAsyncIoProvider& lowLevel) {
  return kj::heap<AsyncIoProviderImpl>(lowLevel);
}